

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

bool duckdb_mbedtls::MbedTlsWrapper::IsValidSha256Signature
               (string *pubkey,string *signature,string *sha256_hash)

{
  int iVar1;
  runtime_error *prVar2;
  mbedtls_pk_context pk_context;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((signature->_M_string_length == 0x100) && (sha256_hash->_M_string_length == 0x20)) {
    mbedtls_pk_init(&pk_context);
    iVar1 = mbedtls_pk_parse_public_key
                      (&pk_context,(uchar *)(pubkey->_M_dataplus)._M_p,pubkey->_M_string_length + 1)
    ;
    if (iVar1 == 0) {
      iVar1 = mbedtls_pk_verify(&pk_context,MBEDTLS_MD_SHA256,
                                (uchar *)(sha256_hash->_M_dataplus)._M_p,
                                sha256_hash->_M_string_length,(uchar *)(signature->_M_dataplus)._M_p
                                ,signature->_M_string_length);
      mbedtls_pk_free(&pk_context);
      return iVar1 == 0;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"RSA public key import error");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_88,signature->_M_string_length);
  std::operator+(&local_68,"Invalid input lengths, expected signature length 256, got ",&local_88);
  std::operator+(&local_48,&local_68,", hash length 32, got ");
  std::__cxx11::to_string(&local_a8,sha256_hash->_M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pk_context,
                 &local_48,&local_a8);
  std::runtime_error::runtime_error(prVar2,(string *)&pk_context);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool MbedTlsWrapper::IsValidSha256Signature(const std::string &pubkey, const std::string &signature,
                                            const std::string &sha256_hash) {

	if (signature.size() != 256 || sha256_hash.size() != 32) {
		throw std::runtime_error("Invalid input lengths, expected signature length 256, got " +
		                         to_string(signature.size()) + ", hash length 32, got " +
		                         to_string(sha256_hash.size()));
	}

	mbedtls_pk_context pk_context;
	mbedtls_pk_init(&pk_context);

	if (mbedtls_pk_parse_public_key(&pk_context, reinterpret_cast<const unsigned char *>(pubkey.c_str()),
	                                pubkey.size() + 1)) {
		throw runtime_error("RSA public key import error");
	}

	// actually verify
	bool valid = mbedtls_pk_verify(&pk_context, MBEDTLS_MD_SHA256,
	                               reinterpret_cast<const unsigned char *>(sha256_hash.data()), sha256_hash.size(),
	                               reinterpret_cast<const unsigned char *>(signature.data()), signature.length()) == 0;

	mbedtls_pk_free(&pk_context);
	return valid;
}